

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvawatch.c
# Opt level: O1

void * twatchfun(void *x)

{
  void *pvVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  
  pvVar1 = nva_cards[cnum]->bar0;
  uVar2 = *(uint32_t *)((long)pvVar1 + (ulong)(uint)a);
  queue[put] = uVar2;
  tqueue[put] = *(uint32_t *)((long)pvVar1 + 0x9400);
  uVar4 = put + 0x100000;
  if (-1 < (int)(put + 1U)) {
    uVar4 = put + 1U;
  }
  put = (put - (uVar4 & 0xfff00000)) + 1;
  do {
    do {
      uVar4 = *(uint *)((long)pvVar1 + (ulong)(uint)a);
      uVar3 = uVar2 ^ uVar4;
      uVar2 = uVar4;
    } while ((uVar3 & mask) == 0);
    queue[put] = uVar4;
    tqueue[put] = *(uint32_t *)((long)pvVar1 + 0x9400);
    uVar4 = put + 0x100000;
    if (-1 < (int)(put + 1U)) {
      uVar4 = put + 1U;
    }
    put = (put - (uVar4 & 0xfff00000)) + 1;
  } while( true );
}

Assistant:

void *twatchfun(void *x) {
	uint32_t val = nva_rd32(cnum, a);
	queue[put] = val;
	tqueue[put] = nva_rd32(cnum, 0x9400);
	put = (put + 1) % SZ;
	while (1) {
		uint32_t nval = nva_rd32(cnum, a);
		if ((nval & mask) != (val & mask)) {
			queue[put] = nval;
			tqueue[put] = nva_rd32(cnum, 0x9400);
			put = (put + 1) % SZ;
		}
		val = nval;
	}
}